

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall Cholesky_solve_Test::TestBody(Cholesky_solve_Test *this)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *pCVar4;
  Scalar *pSVar5;
  long row;
  char *message;
  long col;
  undefined1 local_1b8 [8];
  Matrix<T,_4,_3> K;
  Matrix<T,_4,_3> P;
  undefined4 local_14c [2];
  Matrix<T,_3,_3> S_;
  Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> S;
  Matrix<T,_4,_3> P_;
  Scalar local_a0;
  Scalar local_9c;
  Scalar local_98;
  Scalar local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  AssertHelper local_68;
  DenseMatrixType *local_60;
  float *local_58;
  MatrixTypeNested local_50;
  MatrixTypeNested local_48;
  Scalar local_3c;
  Scalar local_38;
  float local_34;
  
  S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       local_14c;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.4013e-45
  ;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.4013e-45
  ;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  local_14c[0] = 0x3f800000;
  auVar2._12_4_ = 0;
  auVar2._0_12_ = stack0xffffffffffffff0c;
  stack0xffffffffffffff08 =
       (Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>
        )(auVar2 << 0x20);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
                      (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array + 7),
                      (Scalar *)&S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized
                     );
  local_90._0_4_ = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,(Scalar *)local_90);
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[10] = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.
                             m_storage.m_data.array + 10);
  local_68.data_._0_4_ = 0x3f800000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,(Scalar *)&local_68);
  local_50._0_4_ = 0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,(Scalar *)&local_50);
  local_48.m_matrix._0_4_ = 0x3f800000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,(Scalar *)&local_48);
  local_3c = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar3,&local_3c);
  local_38 = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar3,&local_38);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 7));
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ = 0;
  Kalman::Cholesky<Eigen::Matrix<float,3,3,0,3,3>,1>::setL<Eigen::Matrix<float,3,3,0,3,3>>
            ((Cholesky<Eigen::Matrix<float,3,3,0,3,3>,1> *)
             (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 7),(MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)local_14c);
  pfVar1 = K.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array + 10
  ;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[0] = 0.0;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[1] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ = pfVar1;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[2] =
       1.4013e-45;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[3] = 0.0;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[5] = 0.0;
  K.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[10] = 6.0;
  local_90._0_4_ = 4.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)
                      &S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
                      (Scalar *)local_90);
  P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array[10] = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.
                             m_storage.m_data.array + 10);
  local_68.data_._0_4_ = 0x40800000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,(Scalar *)&local_68);
  local_50 = (MatrixTypeNested)CONCAT44(local_50._4_4_,0x41000000);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,(Scalar *)&local_50);
  local_48.m_matrix._0_4_ = 0x40c00000;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,(Scalar *)&local_48);
  local_3c = 2.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,&local_3c);
  local_38 = 6.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,&local_38);
  local_a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,&local_a0);
  local_9c = 3.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,&local_9c);
  local_98 = 5.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_
                     (pCVar4,&local_98);
  local_94 = 7.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::operator_(pCVar4,&local_94);
  Eigen::CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_4,_3,_0,_4,_3>_> *)
             &S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized);
  local_90 = (undefined1  [8])pfVar1;
  join_0x00000010_0x00000000_ =
       Eigen::SolverBase<Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>>::
       solve<Eigen::Transpose<Eigen::Matrix<float,4,3,0,4,3>>>
                 ((SolverBase<Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>> *)
                  (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 7),
                  (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_> *)local_90);
  Eigen::internal::
  call_assignment<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Transpose<Eigen::Solve<Eigen::LLT<Eigen::Matrix<float,3,3,0,3,3>,1>,Eigen::Transpose<Eigen::Matrix<float,4,3,0,4,3>>>const>>
            ((Matrix<float,_4,_3,_0,_4,_3> *)local_1b8,
             (Transpose<const_Eigen::Solve<Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>,_Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>_>
              *)&S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized);
  local_50 = (MatrixTypeNested)
             Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::matrixL
                       ((LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                        (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                         m_data.array + 7));
  Eigen::TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1U>_>::
  toDenseMatrix((DenseMatrixType *)local_90,
                (TriangularBase<Eigen::TriangularView<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1U>_>
                 *)&local_50);
  local_48.m_matrix =
       (non_const_type)
       Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::matrixU
                 ((LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                  (S_.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array + 7));
  pfVar1 = P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.array +
           10;
  Eigen::
  TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_2U>_>
  ::toDenseMatrix((DenseMatrixType *)pfVar1,
                  (TriangularBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,_2U>_>
                   *)&local_48);
  local_68.data_ = (AssertHelperData *)local_1b8;
  local_60 = (DenseMatrixType *)local_90;
  local_58 = pfVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,3,0,4,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<float,4,3,0,4,3>,Eigen::Matrix<float,3,3,0,3,3>,0>,Eigen::Matrix<float,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,4,3,0,4,3>> *)
             &S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<float,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  row = 0;
  do {
    if (row == 4) {
      return;
    }
    for (col = 0; col != 3; col = col + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1> *)
                          (K.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.
                           m_data.array + 10),row,col);
      local_34 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>,_1> *)
                          &S.super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,row,
                          col);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_90,"P(i,j)","P_(i,j)",local_34,*pSVar5);
      if (local_90[0] == (MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>_>)0x0) {
        testing::Message::Message
                  ((Message *)
                   (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.
                    array + 10));
        if (gtest_ar._0_8_ == 0) {
          message = "";
        }
        else {
          message = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/Matrix.cpp"
                   ,0x23,message);
        testing::internal::AssertHelper::operator=
                  (&local_68,
                   (Message *)
                   (P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.m_data.
                    array + 10));
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(P_.super_PlainObjectBase<Eigen::Matrix<float,_4,_3,_0,_4,_3>_>.m_storage.
                          m_data.array + 10));
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        return;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
    }
    row = row + 1;
  } while( true );
}

Assistant:

TEST(Cholesky, solve) {
    Matrix<T, 4, 3> K;
    Matrix<T, 4, 3> P;
    
    // Set S (lower choleksy factor)
    Matrix<T,3,3> S_;
    S_ << 1, 0, 0, 1, 1, 0, 1, 1, 2;
    
    Cholesky<Matrix<T,3,3>> S;
    S.setL(S_);
    
    // Set P
    P << 6, 4, 2, 4, 8, 6, 2, 6, 0, 3, 5, 7;
    
    // Compute K
    K = S.solve(P.transpose()).transpose();

    Matrix<T, 4, 3> P_ = K * S.matrixL().toDenseMatrix() * S.matrixU().toDenseMatrix();
    
    for(int i = 0; i < 4; i++)
    {
        for(int j = 0; j < 3; j++)
        {
            ASSERT_FLOAT_EQ( P(i,j), P_(i,j) );
        }
    }
}